

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

String * __thiscall kj::_::PromiseBase::trace(String *__return_storage_ptr__,PromiseBase *this)

{
  PromiseNode *pPVar1;
  TraceBuilder builder;
  void *space [32];
  String local_158;
  TraceBuilder local_140;
  void *local_128 [32];
  void *local_28;
  
  memset(local_128,0,0x100);
  local_140.limit = &local_28;
  pPVar1 = (this->node).ptr;
  local_140.start = local_128;
  local_140.current = local_128;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar1,&local_140,0);
  TraceBuilder::toString(&local_158,&local_140);
  (__return_storage_ptr__->content).ptr = local_158.content.ptr;
  (__return_storage_ptr__->content).size_ = local_158.content.size_;
  (__return_storage_ptr__->content).disposer = local_158.content.disposer;
  return __return_storage_ptr__;
}

Assistant:

kj::String PromiseBase::trace() {
  void* space[32]{};
  TraceBuilder builder(space);
  node->tracePromise(builder, false);
  return kj::str(builder);
}